

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O2

bool __thiscall
soul::Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
matches(Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
        *this,char *name)

{
  bool bVar1;
  
  bVar1 = matches(this,(TokenType)0x2a3337);
  if (bVar1) {
    bVar1 = std::operator==(&this->currentStringValue,name);
    return bVar1;
  }
  return false;
}

Assistant:

bool matches (const char* name) const                       { return matches (Token::identifier) && currentStringValue == name; }